

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_returns_given_values_Test::TestBody
          (LoginMessageTest_returns_given_values_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_260;
  Message local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_8;
  Message local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_7;
  Message local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_6;
  Message local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LoginMessageTest_returns_given_values_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::price::pixie::LoginMessage::GetUsername_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_20,"USERNAME","login_message.GetUsername()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             USERNAME_abi_cxx11_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  bidfx_public_api::price::pixie::LoginMessage::GetPassword_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_70,"PASSWORD","login_message.GetPassword()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             PASSWORD_abi_cxx11_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  bidfx_public_api::price::pixie::LoginMessage::GetApplication_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_b0,"APPLICATION","login_message.GetApplication()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             APPLICATION_abi_cxx11_,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bidfx_public_api::price::pixie::LoginMessage::GetApplicationVersion_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_f0,"APPLICATION_VERSION",
             "login_message.GetApplicationVersion()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             APPLICATION_VERSION_abi_cxx11_,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  bidfx_public_api::price::pixie::LoginMessage::GetAlias_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_130,"ALIAS","login_message.GetAlias()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ALIAS_abi_cxx11_,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  bidfx_public_api::price::pixie::LoginMessage::GetApi_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_170,"API","login_message.GetApi()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)API_abi_cxx11_,
             &local_190);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  bidfx_public_api::price::pixie::LoginMessage::GetApiVersion_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,"API_VERSION","login_message.GetApiVersion()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             API_VERSION_abi_cxx11_,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  bidfx_public_api::price::pixie::LoginMessage::GetProduct_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_1f0,"\"BidFXCpp\"","login_message.GetProduct()",
             (char (*) [9])"BidFXCpp",&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  bidfx_public_api::price::pixie::LoginMessage::GetProductSerialNumber_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_230,"PRODUCT_SERIAL_NUMBER",
             "login_message.GetProductSerialNumber()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             PRODUCT_SERIAL_NUMBER_abi_cxx11_,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/login_message_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  return;
}

Assistant:

TEST(LoginMessageTest, returns_given_values)
{
    EXPECT_EQ(USERNAME, login_message.GetUsername());
    EXPECT_EQ(PASSWORD, login_message.GetPassword());
    EXPECT_EQ(APPLICATION, login_message.GetApplication());
    EXPECT_EQ(APPLICATION_VERSION, login_message.GetApplicationVersion());
    EXPECT_EQ(ALIAS, login_message.GetAlias());
    EXPECT_EQ(API, login_message.GetApi());
    EXPECT_EQ(API_VERSION, login_message.GetApiVersion());
    EXPECT_EQ("BidFXCpp", login_message.GetProduct());
    EXPECT_EQ(PRODUCT_SERIAL_NUMBER, login_message.GetProductSerialNumber());
}